

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.cpp
# Opt level: O3

void __thiscall
pstd::pmr::NewDeleteResource::do_deallocate
          (NewDeleteResource *this,void *ptr,size_t bytes,size_t alignment)

{
  if (ptr != (void *)0x0) {
    free(ptr);
    return;
  }
  return;
}

Assistant:

void do_deallocate(void *ptr, size_t bytes, size_t alignment) {
        if (ptr == nullptr)
            return;
#if defined(PBRT_HAVE__ALIGNED_MALLOC)
        _aligned_free(ptr);
#else
        free(ptr);
#endif
    }